

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderedStorage.hpp
# Opt level: O2

void __thiscall
supermap::
OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
::appendCopy(OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
             *this,KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *elem)

{
  unique_ptr<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_std::default_delete<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>_>
  uStack_18;
  
  std::
  make_unique<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>,supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>>
            ((KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *)&uStack_18);
  (**this->_vptr_OrderedStorage)(this,&uStack_18);
  std::
  unique_ptr<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_std::default_delete<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>_>
  ::~unique_ptr(&uStack_18);
  return;
}

Assistant:

void appendCopy(T elem) {
        append(std::make_unique<T>(std::move(elem)));
    }